

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O0

png_uint_32
png_get_cHRM_XYZ_fixed
          (png_const_structrp png_ptr,png_const_inforp info_ptr,png_fixed_point *int_red_X,
          png_fixed_point *int_red_Y,png_fixed_point *int_red_Z,png_fixed_point *int_green_X,
          png_fixed_point *int_green_Y,png_fixed_point *int_green_Z,png_fixed_point *int_blue_X,
          png_fixed_point *int_blue_Y,png_fixed_point *int_blue_Z)

{
  png_fixed_point *int_green_X_local;
  png_fixed_point *int_red_Z_local;
  png_fixed_point *int_red_Y_local;
  png_fixed_point *int_red_X_local;
  png_const_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  if (((png_ptr == (png_const_structrp)0x0) || (info_ptr == (png_const_inforp)0x0)) ||
     (((info_ptr->colorspace).flags & 2) == 0)) {
    png_ptr_local._4_4_ = 0;
  }
  else {
    if (int_red_X != (png_fixed_point *)0x0) {
      *int_red_X = (info_ptr->colorspace).end_points_XYZ.red_X;
    }
    if (int_red_Y != (png_fixed_point *)0x0) {
      *int_red_Y = (info_ptr->colorspace).end_points_XYZ.red_Y;
    }
    if (int_red_Z != (png_fixed_point *)0x0) {
      *int_red_Z = (info_ptr->colorspace).end_points_XYZ.red_Z;
    }
    if (int_green_X != (png_fixed_point *)0x0) {
      *int_green_X = (info_ptr->colorspace).end_points_XYZ.green_X;
    }
    if (int_green_Y != (png_fixed_point *)0x0) {
      *int_green_Y = (info_ptr->colorspace).end_points_XYZ.green_Y;
    }
    if (int_green_Z != (png_fixed_point *)0x0) {
      *int_green_Z = (info_ptr->colorspace).end_points_XYZ.green_Z;
    }
    if (int_blue_X != (png_fixed_point *)0x0) {
      *int_blue_X = (info_ptr->colorspace).end_points_XYZ.blue_X;
    }
    if (int_blue_Y != (png_fixed_point *)0x0) {
      *int_blue_Y = (info_ptr->colorspace).end_points_XYZ.blue_Y;
    }
    if (int_blue_Z != (png_fixed_point *)0x0) {
      *int_blue_Z = (info_ptr->colorspace).end_points_XYZ.blue_Z;
    }
    png_ptr_local._4_4_ = 4;
  }
  return png_ptr_local._4_4_;
}

Assistant:

png_uint_32 PNGAPI
png_get_cHRM_XYZ_fixed(png_const_structrp png_ptr, png_const_inforp info_ptr,
    png_fixed_point *int_red_X, png_fixed_point *int_red_Y,
    png_fixed_point *int_red_Z, png_fixed_point *int_green_X,
    png_fixed_point *int_green_Y, png_fixed_point *int_green_Z,
    png_fixed_point *int_blue_X, png_fixed_point *int_blue_Y,
    png_fixed_point *int_blue_Z)
{
   if (png_ptr != NULL && info_ptr != NULL &&
      (info_ptr->colorspace.flags & PNG_COLORSPACE_HAVE_ENDPOINTS) != 0)
   {
      png_debug1(1, "in %s retrieval function", "cHRM_XYZ");

      if (int_red_X != NULL)
         *int_red_X = info_ptr->colorspace.end_points_XYZ.red_X;
      if (int_red_Y != NULL)
         *int_red_Y = info_ptr->colorspace.end_points_XYZ.red_Y;
      if (int_red_Z != NULL)
         *int_red_Z = info_ptr->colorspace.end_points_XYZ.red_Z;
      if (int_green_X != NULL)
         *int_green_X = info_ptr->colorspace.end_points_XYZ.green_X;
      if (int_green_Y != NULL)
         *int_green_Y = info_ptr->colorspace.end_points_XYZ.green_Y;
      if (int_green_Z != NULL)
         *int_green_Z = info_ptr->colorspace.end_points_XYZ.green_Z;
      if (int_blue_X != NULL)
         *int_blue_X = info_ptr->colorspace.end_points_XYZ.blue_X;
      if (int_blue_Y != NULL)
         *int_blue_Y = info_ptr->colorspace.end_points_XYZ.blue_Y;
      if (int_blue_Z != NULL)
         *int_blue_Z = info_ptr->colorspace.end_points_XYZ.blue_Z;
      return (PNG_INFO_cHRM);
   }

   return (0);
}